

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qvkgen.cpp
# Opt level: O1

void __thiscall VkSpecParser::parseFeature(VkSpecParser *this)

{
  qsizetype qVar1;
  char16_t *pcVar2;
  char cVar3;
  byte bVar4;
  byte bVar5;
  int iVar6;
  iterator iVar7;
  iterator iVar8;
  QArrayData *pQVar9;
  QXmlStreamAttribute *attr;
  long in_FS_OFFSET;
  QStringView QVar10;
  QStringView QVar11;
  QStringView QVar12;
  QStringView QVar13;
  QStringView QVar14;
  QStringView QVar15;
  QStringView QVar16;
  QStringView QVar17;
  QStringView QVar18;
  undefined1 auVar19 [16];
  QString local_c0;
  QString local_a8;
  QArrayDataPointer<QXmlStreamAttribute> local_90;
  QString local_78;
  QArrayData *local_58;
  char16_t *pcStack_50;
  qsizetype local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_58 = (QArrayData *)0x0;
  pcStack_50 = (char16_t *)0x0;
  local_48 = 0;
  local_78.d.d = (Data *)0x0;
  local_78.d.ptr = (char16_t *)0x0;
  local_78.d.size = 0;
  QXmlStreamReader::attributes();
  iVar7 = QList<QXmlStreamAttribute>::begin((QList<QXmlStreamAttribute> *)&local_90);
  iVar8 = QList<QXmlStreamAttribute>::end((QList<QXmlStreamAttribute> *)&local_90);
  if (iVar7.i != iVar8.i) {
    do {
      if (((iVar7.i)->m_name).m_string.size == 3) {
        QVar10.m_data = ((iVar7.i)->m_name).m_string.ptr;
        QVar10.m_size = 3;
        QVar14.m_data = L"api";
        QVar14.m_size = 3;
        cVar3 = QtPrivate::equalStrings(QVar10,QVar14);
        if (cVar3 == '\0') goto LAB_00103167;
        QString::QString(&local_c0,(QChar *)((iVar7.i)->m_value).m_string.ptr,
                         ((iVar7.i)->m_value).m_string.size);
        QString::trimmed_helper(&local_a8);
        pcVar2 = pcStack_50;
        pQVar9 = local_58;
        qVar1 = local_a8.d.size;
        local_58 = &(local_a8.d.d)->super_QArrayData;
        pcStack_50 = local_a8.d.ptr;
        local_a8.d.ptr = pcVar2;
        local_a8.d.size = local_48;
        local_48 = qVar1;
LAB_001031d5:
        local_a8.d.d = (Data *)pQVar9;
        if (pQVar9 != (QArrayData *)0x0) {
          LOCK();
          (pQVar9->ref_)._q_value.super___atomic_base<int>._M_i =
               (pQVar9->ref_)._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if ((pQVar9->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(pQVar9,2,0x10);
          }
        }
        if (&(local_c0.d.d)->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          ((local_c0.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               ((local_c0.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if (((local_c0.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(&(local_c0.d.d)->super_QArrayData,2,0x10);
          }
        }
      }
      else {
LAB_00103167:
        if (((iVar7.i)->m_name).m_string.size == 4) {
          QVar11.m_data = ((iVar7.i)->m_name).m_string.ptr;
          QVar11.m_size = 4;
          QVar15.m_data = L"name";
          QVar15.m_size = 4;
          cVar3 = QtPrivate::equalStrings(QVar11,QVar15);
          if (cVar3 != '\0') {
            QString::QString(&local_c0,(QChar *)((iVar7.i)->m_value).m_string.ptr,
                             ((iVar7.i)->m_value).m_string.size);
            QString::trimmed_helper(&local_a8);
            pcVar2 = local_78.d.ptr;
            pQVar9 = &(local_78.d.d)->super_QArrayData;
            qVar1 = local_a8.d.size;
            local_78.d.d = local_a8.d.d;
            local_78.d.ptr = local_a8.d.ptr;
            local_a8.d.ptr = pcVar2;
            local_a8.d.size = local_78.d.size;
            local_78.d.size = qVar1;
            goto LAB_001031d5;
          }
        }
      }
      iVar7.i = iVar7.i + 1;
    } while (iVar7.i != iVar8.i);
  }
  QArrayDataPointer<QXmlStreamAttribute>::~QArrayDataPointer(&local_90);
  QString::split(&local_90,&local_58,0x2c,0,1);
  QVar18.m_data = L"vulkan";
  QVar18.m_size = 6;
  bVar4 = QtPrivate::QStringList_contains((QList *)&local_90,QVar18,CaseSensitive);
  QArrayDataPointer<QString>::~QArrayDataPointer((QArrayDataPointer<QString> *)&local_90);
  cVar3 = QXmlStreamReader::atEnd();
  if (cVar3 == '\0') {
    do {
      QXmlStreamReader::readNext();
      iVar6 = QXmlStreamReader::tokenType();
      if (iVar6 == 5) {
        auVar19 = QXmlStreamReader::name();
        if (auVar19._0_8_ == 7) {
          QVar12.m_data = auVar19._8_8_;
          QVar12.m_size = 7;
          QVar16.m_data = L"feature";
          QVar16.m_size = 7;
          cVar3 = QtPrivate::equalStrings(QVar12,QVar16);
          if (cVar3 != '\0') break;
        }
      }
      iVar6 = QXmlStreamReader::tokenType();
      if (iVar6 == 4) {
        auVar19 = QXmlStreamReader::name();
        if (auVar19._0_8_ != 7) goto LAB_00103300;
        QVar13.m_data = auVar19._8_8_;
        QVar13.m_size = 7;
        QVar17.m_data = L"require";
        QVar17.m_size = 7;
        bVar5 = QtPrivate::equalStrings(QVar13,QVar17);
      }
      else {
LAB_00103300:
        bVar5 = 0;
      }
      if ((bVar5 & bVar4) == 1) {
        parseFeatureRequire(this,&local_78);
      }
      cVar3 = QXmlStreamReader::atEnd();
    } while (cVar3 == '\0');
  }
  if (&(local_78.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_78.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (local_58 != (QArrayData *)0x0) {
    LOCK();
    (local_58->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_58->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_58->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_58,2,0x10);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void VkSpecParser::parseFeature()
{
    // <feature api="vulkan" name="VK_VERSION_1_0" number="1.0" comment="Vulkan core API interface definitions">
    //   <require comment="Device initialization">

    QString api;
    QString versionName;
    for (const QXmlStreamAttribute &attr : m_reader.attributes()) {
        if (attr.name() == QStringLiteral("api"))
            api = attr.value().toString().trimmed();
        else if (attr.name() == QStringLiteral("name"))
            versionName = attr.value().toString().trimmed();
    }
    const bool isVulkan = api.split(',').contains(QStringLiteral("vulkan"));

    while (!m_reader.atEnd()) {
        m_reader.readNext();
        if (m_reader.isEndElement() && m_reader.name() == QStringLiteral("feature"))
            return;
        if (m_reader.isStartElement() && m_reader.name() == QStringLiteral("require")) {
            if (isVulkan)
                parseFeatureRequire(versionName);
        }
    }
}